

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O0

void __thiscall Shortcut_Button::draw(Shortcut_Button *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char local_418 [8];
  char buf [1024];
  Shortcut_Button *this_local;
  
  cVar1 = Fl_Button::value(&this->super_Fl_Button);
  if (cVar1 == '\0') {
    Fl_Widget::draw_box((Fl_Widget *)this,FL_UP_BOX,0xff);
  }
  else {
    Fl_Widget::draw_box((Fl_Widget *)this,FL_DOWN_BOX,9);
  }
  fl_font(0,0xe);
  fl_color(0);
  if ((use_FL_COMMAND == 0) || ((this->svalue & 0x440000U) == 0)) {
    pcVar6 = fl_shortcut_label(this->svalue);
    iVar2 = Fl_Widget::x((Fl_Widget *)this);
    iVar3 = Fl_Widget::y((Fl_Widget *)this);
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    fl_draw(pcVar6,iVar2 + 6,iVar3,iVar4,iVar5,4,(Fl_Image *)0x0,1);
  }
  else {
    pcVar6 = fl_shortcut_label(this->svalue & 0xffbbffff);
    fl_snprintf(local_418,0x3ff,"Command+%s",pcVar6);
    iVar2 = Fl_Widget::x((Fl_Widget *)this);
    iVar3 = Fl_Widget::y((Fl_Widget *)this);
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    fl_draw(local_418,iVar2 + 6,iVar3,iVar4,iVar5,4,(Fl_Image *)0x0,1);
  }
  return;
}

Assistant:

void Shortcut_Button::draw() {
  if (value()) draw_box(FL_DOWN_BOX, (Fl_Color)9);
  else draw_box(FL_UP_BOX, FL_WHITE);
  fl_font(FL_HELVETICA,14); fl_color(FL_FOREGROUND_COLOR);
	if (use_FL_COMMAND && (svalue & (FL_CTRL|FL_META))) {
		char buf[1024];
		fl_snprintf(buf, 1023, "Command+%s", fl_shortcut_label(svalue&~(FL_CTRL|FL_META)));
		fl_draw(buf,x()+6,y(),w(),h(),FL_ALIGN_LEFT);
	} else {
		fl_draw(fl_shortcut_label(svalue),x()+6,y(),w(),h(),FL_ALIGN_LEFT);
	}
}